

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_construct.cc
# Opt level: O0

void __thiscall
re2c::Cpgoto::Cpgoto
          (Cpgoto *this,Span *span,uint32_t nSpans,Span *hspan,uint32_t hSpans,State *next)

{
  CpgotoTable *this_00;
  SwitchIf *local_68;
  State *next_local;
  uint32_t hSpans_local;
  Span *hspan_local;
  uint32_t nSpans_local;
  Span *span_local;
  Cpgoto *this_local;
  
  if (hSpans == 0) {
    local_68 = (SwitchIf *)0x0;
  }
  else {
    local_68 = (SwitchIf *)operator_new(0x10);
    SwitchIf::SwitchIf(local_68,hspan,hSpans,next);
  }
  this->hgo = local_68;
  this_00 = (CpgotoTable *)operator_new(8);
  CpgotoTable::CpgotoTable(this_00,span,nSpans);
  this->table = this_00;
  return;
}

Assistant:

Cpgoto::Cpgoto (const Span * span, uint32_t nSpans, const Span * hspan, uint32_t hSpans, const State * next)
	: hgo (hSpans == 0 ? NULL : new SwitchIf (hspan, hSpans, next))
	, table (new CpgotoTable (span, nSpans))
{}